

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_util.h
# Opt level: O0

void __thiscall cppcms::impl::shared_mutex::shared_mutex(shared_mutex *this)

{
  undefined1 uVar1;
  void *pvVar2;
  FILE *pFVar3;
  undefined8 uVar4;
  noncopyable *in_RDI;
  string *unaff_retaddr;
  int in_stack_0000000c;
  cppcms_error *in_stack_00000010;
  int err;
  bool use_pthread;
  allocator local_41;
  string local_40 [32];
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffef;
  undefined7 in_stack_fffffffffffffff0;
  
  booster::noncopyable::noncopyable(in_RDI);
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  uVar1 = test_pthread_mutex_pshared();
  if ((bool)uVar1) {
    pvVar2 = mmap_anonymous(CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    *(void **)in_RDI = pvVar2;
    create_rwlock((pthread_rwlock_t *)CONCAT17(uVar1,in_stack_fffffffffffffff0),
                  (bool)in_stack_ffffffffffffffef);
  }
  else {
    *(noncopyable **)in_RDI = in_RDI + 0x10;
    create_rwlock((pthread_rwlock_t *)CONCAT17(uVar1,in_stack_fffffffffffffff0),
                  (bool)in_stack_ffffffffffffffef);
    pFVar3 = tmpfile();
    *(FILE **)(in_RDI + 8) = pFVar3;
    if (*(long *)(in_RDI + 8) == 0) {
      __errno_location();
      destroy_rwlock((pthread_rwlock_t *)0x41e6e8);
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Failed to create temporary file",&local_41);
      cppcms_error::cppcms_error(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
      __cxa_throw(uVar4,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
    }
  }
  return;
}

Assistant:

shared_mutex() :
			plock_(0),
			flock_(0)
		{
			bool use_pthread=test_pthread_mutex_pshared();
			if(use_pthread) {
				plock_ =reinterpret_cast<pthread_rwlock_t *>(mmap_anonymous(sizeof(pthread_rwlock_t)));
				create_rwlock(plock_,true);
			}
			else {
				plock_=&normal_;
				create_rwlock(plock_,false);
				flock_=tmpfile();
				if(!flock_) {
					int err=errno;
					destroy_rwlock(plock_);
					throw cppcms_error(err,"Failed to create temporary file");
				}
			}
		}